

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_fireproof(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  OBJ_AFFECT_DATA oaf;
  
  bVar1 = is_obj_stat((OBJ_DATA *)vo,0x18);
  if (bVar1) {
    act("$p is already protected from burning.",ch,vo,(void *)0x0,3);
    return;
  }
  init_affect_obj(&oaf);
  oaf.where = 0;
  oaf.type = (short)sn;
  oaf.level = (short)level;
  iVar2 = number_fuzzy(level / 4);
  oaf.duration = (short)iVar2;
  oaf.location = 0;
  oaf.modifier = 0;
  oaf.bitvector[0]._3_1_ = oaf.bitvector[0]._3_1_ | 1;
  affect_to_obj((OBJ_DATA *)vo,&oaf);
  act("You protect $p from fire.",ch,vo,(void *)0x0,3);
  act("$p is surrounded by a protective aura.",ch,vo,(void *)0x0,0);
  return;
}

Assistant:

void spell_fireproof(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	OBJ_AFFECT_DATA oaf;

	if (is_obj_stat(obj, ITEM_BURN_PROOF))
	{
		act("$p is already protected from burning.", ch, obj, nullptr, TO_CHAR);
		return;
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = sn;
	oaf.level = level;
	oaf.duration = number_fuzzy(level / 4);
	oaf.location = APPLY_NONE;
	oaf.modifier = 0;
	SET_BIT(oaf.bitvector, ITEM_BURN_PROOF);

	affect_to_obj(obj, &oaf);

	act("You protect $p from fire.", ch, obj, nullptr, TO_CHAR);
	act("$p is surrounded by a protective aura.", ch, obj, nullptr, TO_ROOM);
}